

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O1

void __thiscall QGraphicsItem::setCursor(QGraphicsItem *this,QCursor *cursor)

{
  QList<QGraphicsItemPrivate::ExtraStruct> *this_00;
  undefined1 *puVar1;
  uint *puVar2;
  QGraphicsItemPrivate *pQVar3;
  QGraphicsScene *pQVar4;
  QWidget *this_01;
  undefined1 auVar5 [16];
  bool bVar6;
  char cVar7;
  int iVar8;
  QMetaType QVar9;
  pointer pEVar10;
  QWidget *this_02;
  undefined8 uVar11;
  long lVar12;
  long lVar13;
  anon_union_24_3_e3d07ef4_for_data *paVar14;
  ExtraStruct *pEVar15;
  long in_FS_OFFSET;
  QCursor t;
  QPoint viewPoint;
  undefined1 local_110 [16];
  undefined1 *puStack_100;
  undefined1 *local_f8;
  QPointF local_e8;
  QPoint local_d0;
  QVariant local_c8;
  anon_union_24_3_e3d07ef4_for_data local_a8;
  anon_union_24_3_e3d07ef4_for_data local_88;
  undefined1 *puStack_70;
  undefined1 local_68 [8];
  undefined1 auStack_60 [16];
  char *pcStack_50;
  QMetaTypeInterface *local_48;
  InterfaceType *pIStack_40;
  long local_38;
  
  auStack_60._0_8_ = local_68;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  paVar14 = &local_88;
  local_88._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  local_88.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  local_88._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  ::QVariant::QVariant((QVariant *)local_68,(QMetaType)0x7f5f00,cursor);
  (*this->_vptr_QGraphicsItem[0x21])(paVar14,this,0x11,(QVariant *)local_68);
  ::QVariant::~QVariant((QVariant *)local_68);
  pQVar3 = (this->d_ptr).d;
  local_68 = (undefined1  [8])&QtPrivate::QMetaTypeInterfaceWrapper<QCursor>::metaType;
  local_a8.shared = (PrivateShared *)((ulong)puStack_70 & 0xfffffffffffffffc);
  bVar6 = comparesEqual((QMetaType *)&local_a8.shared,(QMetaType *)local_68);
  if (bVar6) {
    if (((ulong)puStack_70 & 1) == 0) {
      paVar14 = &local_88;
    }
    else {
      paVar14 = (anon_union_24_3_e3d07ef4_for_data *)
                (local_88.shared + *(int *)(local_88.shared + 4));
    }
    QCursor::QCursor((QCursor *)(local_110 + 8),(QCursor *)&paVar14->shared);
  }
  else {
    local_110._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QCursor::QCursor((QCursor *)(local_110 + 8));
    QVar9.d_ptr = (QMetaTypeInterface *)::QVariant::metaType();
    if (((ulong)puStack_70 & 1) != 0) {
      paVar14 = (anon_union_24_3_e3d07ef4_for_data *)
                (local_88.shared + *(int *)(local_88.shared + 4));
    }
    QMetaType::convert(QVar9,paVar14,(QMetaType)local_68,local_110 + 8);
  }
  QCursor::operator_cast_to_QVariant((QVariant *)&local_a8,(QCursor *)(local_110 + 8));
  lVar13 = (pQVar3->extras).d.size;
  iVar8 = -1;
  if (lVar13 != 0) {
    pEVar15 = (pQVar3->extras).d.ptr;
    lVar12 = 0;
    do {
      if (pEVar15->type == ExtraCursor) {
        iVar8 = (int)lVar12;
        break;
      }
      lVar12 = lVar12 + 1;
      pEVar15 = pEVar15 + 1;
    } while (lVar13 != lVar12);
  }
  this_00 = &pQVar3->extras;
  if (iVar8 == -1) {
    local_68._0_4_ = 1;
    ::QVariant::QVariant((QVariant *)(local_68 + 8),(QVariant *)&local_a8);
    QtPrivate::QMovableArrayOps<QGraphicsItemPrivate::ExtraStruct>::
    emplace<QGraphicsItemPrivate::ExtraStruct>
              ((QMovableArrayOps<QGraphicsItemPrivate::ExtraStruct> *)this_00,
               (pQVar3->extras).d.size,(ExtraStruct *)local_68);
    QList<QGraphicsItemPrivate::ExtraStruct>::end(this_00);
    ::QVariant::~QVariant((QVariant *)(local_68 + 8));
  }
  else {
    pEVar10 = QList<QGraphicsItemPrivate::ExtraStruct>::data(this_00);
    ::QVariant::operator=(&pEVar10[iVar8].value,(QVariant *)&local_a8);
  }
  ::QVariant::~QVariant((QVariant *)&local_a8);
  QCursor::~QCursor((QCursor *)(local_110 + 8));
  puVar1 = &((this->d_ptr).d)->field_0x160;
  *(ulong *)puVar1 = *(ulong *)puVar1 | 0x8000;
  pQVar4 = ((this->d_ptr).d)->scene;
  if (pQVar4 == (QGraphicsScene *)0x0) goto LAB_005e8dfb;
  puVar2 = (uint *)(*(long *)&pQVar4->field_0x8 + 0xb8);
  *puVar2 = *puVar2 & 0xffffdfff;
  local_a8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_a8.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  local_a8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QGraphicsScene::views
            ((QList<QGraphicsView_*> *)&local_a8,(QGraphicsScene *)((this->d_ptr).d)->scene);
  uVar11 = local_a8._8_8_;
  if ((undefined1 *)local_a8._16_8_ != (undefined1 *)0x0) {
    lVar12 = local_a8._16_8_ << 3;
    lVar13 = 0;
    do {
      this_01 = *(QWidget **)(uVar11 + lVar13);
      this_02 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this_01);
      QWidget::setAttribute(this_02,WA_MouseTracking,true);
      if ((this_01->data->widget_attributes & 2) != 0) {
        local_d0 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
        uVar11 = QCursor::pos();
        local_68 = (undefined1  [8])uVar11;
        local_d0 = QWidget::mapFromGlobal(this_01,(QPoint *)local_68);
        local_e8.yp._0_4_ = 0xffffffff;
        local_e8.xp = -NAN;
        local_e8.yp._4_4_ = 0xffffffff;
        _local_68 = (undefined1  [16])QGraphicsView::mapToScene((QGraphicsView *)this_01,&local_d0);
        local_e8 = mapFromScene(this,(QPointF *)local_68);
        (*this->_vptr_QGraphicsItem[3])((QPointF *)local_68,this);
        cVar7 = QRectF::contains((QPointF *)local_68);
        if (cVar7 != '\0') {
          local_f8 = &DAT_aaaaaaaaaaaaaaaa;
          local_110._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          puStack_100 = &DAT_aaaaaaaaaaaaaaaa;
          QGraphicsView::items
                    ((QList<QGraphicsItem_*> *)(local_110 + 8),(QGraphicsView *)this_01,&local_d0);
          if (local_f8 == (undefined1 *)0x0) goto LAB_005e8db5;
          lVar13 = 0;
          goto LAB_005e8d1c;
        }
        break;
      }
      lVar13 = lVar13 + 8;
    } while (lVar12 != lVar13);
  }
  goto LAB_005e8dd8;
  while (lVar13 = lVar13 + 8, (long)local_f8 << 3 != lVar13) {
LAB_005e8d1c:
    if ((*(byte *)(*(long *)(*(long *)(puStack_100 + lVar13) + 8) + 0x161) & 0x80) != 0) {
      QGraphicsItem::cursor((QGraphicsItem *)local_110);
      auVar5._8_8_ = 0;
      auVar5._0_8_ = (QGraphicsItem *)local_110;
      _local_68 = auVar5 << 0x40;
      auStack_60._8_8_ = 0;
      pcStack_50 = "QCursor";
      local_48 = (QMetaTypeInterface *)0x0;
      pIStack_40 = &QtPrivate::QMetaTypeInterfaceWrapper<QCursor>::metaType;
      QMetaObject::invokeMethodImpl
                (&this_01->super_QObject,"_q_setViewportCursor",AutoConnection,2,(void **)local_68,
                 (char **)(auStack_60 + 8),&local_48);
      QCursor::~QCursor((QCursor *)local_110);
      break;
    }
  }
LAB_005e8db5:
  if ((QGraphicsItemPrivate *)local_110._8_8_ != (QGraphicsItemPrivate *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_110._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_110._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_110._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_110._8_8_,8,0x10);
    }
  }
LAB_005e8dd8:
  if ((QArrayData *)local_a8.shared != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_a8.shared = *(int *)local_a8.shared + -1;
    UNLOCK();
    if (*(int *)local_a8.shared == 0) {
      QArrayData::deallocate((QArrayData *)local_a8.shared,8,0x10);
    }
  }
LAB_005e8dfb:
  (*this->_vptr_QGraphicsItem[0x21])(&local_c8,this,0x12,&local_88);
  ::QVariant::~QVariant(&local_c8);
  ::QVariant::~QVariant((QVariant *)&local_88);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsItem::setCursor(const QCursor &cursor)
{
    const QVariant cursorVariant(itemChange(ItemCursorChange, QVariant::fromValue<QCursor>(cursor)));
    d_ptr->setExtra(QGraphicsItemPrivate::ExtraCursor, qvariant_cast<QCursor>(cursorVariant));
    d_ptr->hasCursor = 1;
    if (d_ptr->scene) {
        d_ptr->scene->d_func()->allItemsUseDefaultCursor = false;
        const auto views = d_ptr->scene->views();
        for (QGraphicsView *view : views) {
            view->viewport()->setMouseTracking(true);
            // Note: Some of this logic is duplicated in QGraphicsView's mouse events.
            if (view->underMouse()) {
                const QPoint viewPoint = view->mapFromGlobal(QCursor::pos());
                const QPointF cursorPos = mapFromScene(view->mapToScene(viewPoint));
                // the cursor can only change if the current item is under the mouse
                if (boundingRect().contains(cursorPos)) {
                    const auto itemsUnderCursor = view->items(viewPoint);
                    for (QGraphicsItem *itemUnderCursor : itemsUnderCursor) {
                        if (itemUnderCursor->hasCursor()) {
                            QMetaObject::invokeMethod(view, "_q_setViewportCursor",
                                                      Q_ARG(QCursor, itemUnderCursor->cursor()));
                            break;
                        }
                    }
                }
                break;
            }
        }
    }
    itemChange(ItemCursorHasChanged, cursorVariant);
}